

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool> *
__thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert
          (pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
           *__return_storage_ptr__,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val)

{
  pointer pvVar1;
  pair<int,_int> *ppVar2;
  pointer pvVar3;
  ValueIterator VVar4;
  pointer pvVar5;
  pointer pvVar6;
  pair<int,_int> *ppVar7;
  size_t bucketIdx;
  ulong local_18;
  
  *(undefined8 *)((long)&(__return_storage_ptr__->first).mCurBucketItr._M_current + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).mEndBucketItr._M_current + 1) = 0;
  (__return_storage_ptr__->first).mCurValueItr._M_current = (pair<int,_int> *)0x0;
  (__return_storage_ptr__->first).mCurBucketItr._M_current =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
  pvVar1 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_18 = (ulong)(long)val->first %
             (ulong)(((long)(this->mBuckets).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                    -0x5555555555555555);
  ppVar2 = *(pointer *)
            ((long)&pvVar1[local_18].
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl + 8);
  for (ppVar7 = *(pair<int,_int> **)
                 &pvVar1[local_18].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl;
      (VVar4._M_current = ppVar2, ppVar7 != ppVar2 &&
      (VVar4._M_current = ppVar7, ppVar7->first != val->first)); ppVar7 = ppVar7 + 1) {
  }
  __return_storage_ptr__->second = false;
  if (VVar4._M_current == ppVar2) {
    VVar4 = insert_to_bucket(this,val,&local_18);
    __return_storage_ptr__->second = true;
  }
  pvVar6 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + local_18;
  pvVar1 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pvVar6 != pvVar1) &&
     (pvVar5 = pvVar6,
     (pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
     _M_impl.super__Vector_impl_data._M_finish == VVar4._M_current)) {
    do {
      pvVar6 = pvVar5 + 1;
      if (pvVar6 == pvVar1) break;
      VVar4._M_current =
           (pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
      pvVar3 = pvVar5 + 1;
      pvVar5 = pvVar6;
    } while (VVar4._M_current ==
             (pvVar3->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->first).mCurValueItr._M_current = VVar4._M_current;
  (__return_storage_ptr__->first).mCurBucketItr._M_current = pvVar6;
  (__return_storage_ptr__->first).mEndBucketItr._M_current = pvVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator,bool> insert(const ValueT& val) {
      std::pair<iterator,bool> result;
      size_t bucketIdx = hash_to_bucket(val.first);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx], val.first);
      result.second = false;
      if (it == mBuckets[bucketIdx].end()) {
        it = insert_to_bucket(val, bucketIdx );
        result.second = true;
      }
      result.first = iterator(it,
                              mBuckets.begin()+bucketIdx,
                              mBuckets.end());
      return result;
    }